

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddl.cpp
# Opt level: O2

void __thiscall ddl::createType(ddl *this,string *typeName,int numFields,string *fields)

{
  SystemCatalog *pSVar1;
  int iVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *__n;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  string local_100;
  string local_e0;
  type type;
  undefined1 local_68 [56];
  
  iVar3 = SystemCatalog::getType(this->systemCatalog,typeName);
  __n = &(this->systemCatalog->types)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == __n) {
    ::type::type(&type,typeName,(uint8_t)numFields);
    uVar7 = 0;
    uVar6 = (ulong)(uint)numFields;
    if (numFields < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 * 0x20 != uVar7; uVar7 = uVar7 + 0x20) {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((type.fieldsName.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar7));
    }
    pSVar1 = this->systemCatalog;
    uVar5 = 4;
    for (p_Var4 = (pSVar1->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pSVar1->types)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      iVar2 = calcTypeSize((uint)(byte)(char)p_Var4[2]._M_color);
      uVar5 = uVar5 + iVar2;
    }
    pSVar1 = this->systemCatalog;
    pSVar1->numTypes = pSVar1->numTypes + 1;
    SystemCatalog::writeNumTypes(pSVar1);
    std::__cxx11::string::string((string *)&local_e0,(string *)typeName);
    type.dir = createIndex(&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    ::type::write(&type,(int)this->systemCatalog + 0x38,(void *)(ulong)uVar5,(size_t)__n);
    std::_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>>::
    _M_insert_unique<type_const&>
              ((_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>> *)
               &this->systemCatalog->types,&type);
    std::__cxx11::string::string((string *)&local_100,(string *)typeName);
    createAndLinkFiles((file *)local_68,&local_100,1,0,0);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    std::__cxx11::string::~string((string *)&local_100);
    ::type::~type(&type);
  }
  return;
}

Assistant:

void ddl::createType(std::string typeName, int numFields, std::string *fields) {
    auto i = systemCatalog->getType(typeName);

    if(i != systemCatalog->types.end()) {
        return;
    }

    type type(typeName, (int8_t ) numFields);

    for (int j = 0; j < numFields; ++j) {
        type.fieldsName[j] = fields[j];
    }

    int pos = NUM_TYPES;

    //Get the end of file;
    for(auto & _i : systemCatalog->types) {
        pos += calcTypeSize(_i.numFields);

    }

    systemCatalog->numTypes++;

    systemCatalog->writeNumTypes();

    type.dir = createIndex(typeName);

    type.write(systemCatalog->catalogFile, pos);

    systemCatalog->types.insert(type);

    createAndLinkFiles(typeName, 1, 0, 0);
}